

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_7::Validator::CheckModule(Validator *this,Module *module)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  Var *pVVar4;
  Result RVar5;
  char *format;
  Exception *except;
  ModuleField *pMVar6;
  Location *var_00;
  ModuleField *pMVar7;
  Var *var;
  Var *var_01;
  bool bVar8;
  ModuleField *field;
  undefined1 local_98 [8];
  Func *start_func;
  _Manager_type local_88;
  code *local_80;
  pointer local_78;
  pointer local_60;
  ulong local_48;
  TypeChecker *local_40;
  Module *local_38;
  
  this->current_module_ = module;
  this->current_table_index_ = 0;
  this->current_memory_index_ = 0;
  this->current_global_index_ = 0;
  this->num_imported_globals_ = 0;
  this->current_except_index_ = 0;
  pMVar7 = (module->fields).first_;
  local_38 = module;
  if (pMVar7 != (ModuleField *)0x0) {
    local_40 = &this->typechecker_;
    local_48 = 0x3fffffff8;
    bVar8 = false;
    do {
      switch(pMVar7->type_) {
      case Func:
        var_00 = &pMVar7->loc;
        this->current_func_ = (Func *)(pMVar7 + 1);
        CheckFuncSignature(this,var_00,(FuncDeclaration *)&pMVar7[1].loc.filename.size_);
        if (((this->options_->features).multi_value_enabled_ == false) &&
           ((local_48 &
            (long)pMVar7[3].super_intrusive_list_base<wabt::ModuleField>.prev_ -
            (long)pMVar7[3].super_intrusive_list_base<wabt::ModuleField>.next_) != 0)) {
          format = "multiple result values not currently supported.";
LAB_00f543b0:
          PrintError(this,var_00,format);
        }
        else {
          this->expr_loc_ = var_00;
          TypeChecker::BeginFunction
                    (local_40,(TypeVector *)&pMVar7[3].super_intrusive_list_base<wabt::ModuleField>)
          ;
          ExprVisitor::ExprVisitor((ExprVisitor *)local_98,&this->super_Delegate);
          ExprVisitor::VisitExprList
                    ((ExprVisitor *)local_98,(ExprList *)((long)&pMVar7[4].loc.field_1 + 8));
          if (local_60 != (pointer)0x0) {
            operator_delete(local_60);
          }
          if (local_78 != (pointer)0x0) {
            operator_delete(local_78);
          }
          if (start_func != (Func *)0x0) {
            operator_delete(start_func);
          }
          TypeChecker::EndFunction(local_40);
          this->current_func_ = (Func *)0x0;
        }
        break;
      case Global:
        CheckConstInitExpr(this,&pMVar7->loc,(ExprList *)pMVar7[1].loc.field_1.field_1.offset,
                           (Type)*(undefined8 *)&pMVar7[1].type_,
                           (char *)(ulong)(uint)pMVar7[1].loc.filename.size_);
        this->current_global_index_ = this->current_global_index_ + 1;
        break;
      case Import:
        pp_Var3 = pMVar7[1]._vptr_ModuleField;
        if (*(uint *)(pp_Var3 + 9) < 5) {
          switch(*(uint *)(pp_Var3 + 9)) {
          case 0:
            if (*(char *)(pp_Var3 + 0xe) == '\x01') {
              CheckFuncTypeVar(this,(Var *)(pp_Var3 + 0xf),(FuncType **)0x0);
            }
            break;
          case 1:
            pMVar6 = (ModuleField *)(pp_Var3 + 10);
            goto LAB_00f544e2;
          case 2:
            pMVar6 = (ModuleField *)(pp_Var3 + 10);
            goto LAB_00f543c6;
          case 3:
            if ((*(char *)((long)pp_Var3 + 0x74) == '\x01') &&
               ((this->options_->features).mutable_globals_enabled_ == false)) {
              PrintError(this,&pMVar7->loc,"mutable globals cannot be imported");
            }
            uVar1 = this->current_global_index_;
            uVar2 = this->num_imported_globals_;
            this->current_global_index_ = uVar1 + 1;
            this->num_imported_globals_ = uVar2 + 1;
            break;
          case 4:
            this->current_except_index_ = this->current_except_index_ + 1;
            except = (Exception *)pp_Var3[0xe];
            goto LAB_00f54454;
          }
        }
        break;
      case Export:
        switch((int)pMVar7[1].loc.filename.size_) {
        case 0:
          CheckFuncVar(this,(Var *)&pMVar7[1].loc.field_1.field_0,(Func **)0x0);
          break;
        case 1:
          CheckTableVar(this,(Var *)&pMVar7[1].loc.field_1.field_0,(Table **)0x0);
          break;
        case 2:
          CheckMemoryVar(this,(Var *)&pMVar7[1].loc.field_1.field_0,(Memory **)0x0);
          break;
        case 3:
          var_00 = (Location *)&pMVar7[1].loc.field_1;
          RVar5 = CheckGlobalVar(this,(Var *)var_00,(Global **)local_98,(Index *)0x0);
          if (((RVar5.enum_ == Ok) && (*(code *)((long)local_98 + 0x24) == (code)0x1)) &&
             ((this->options_->features).mutable_globals_enabled_ == false)) {
            format = "mutable globals cannot be exported";
            goto LAB_00f543b0;
          }
          break;
        case 4:
          CheckExceptVar(this,(Var *)&pMVar7[1].loc.field_1.field_0,(Exception **)0x0);
        }
        break;
      case Table:
        pMVar6 = pMVar7 + 1;
LAB_00f544e2:
        CheckTable(this,&pMVar7->loc,(Table *)pMVar6);
        this->current_table_index_ = this->current_table_index_ + 1;
        break;
      case Memory:
        pMVar6 = pMVar7 + 1;
LAB_00f543c6:
        CheckMemory(this,&pMVar7->loc,(Memory *)pMVar6);
        this->current_memory_index_ = this->current_memory_index_ + 1;
        break;
      case Start:
        if (bVar8) {
          PrintError(this,&pMVar7->loc,"only one start function allowed");
          local_98 = (undefined1  [8])0x0;
          if (pMVar7->type_ != Start) {
            __assert_fail("isa<Derived>(base)",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                          ,0x48,
                          "const Derived *wabt::cast(const Base *) [Derived = wabt::StartModuleField, Base = wabt::ModuleField]"
                         );
          }
        }
        local_98 = (undefined1  [8])0x0;
        CheckFuncVar(this,(Var *)(pMVar7 + 1),(Func **)local_98);
        if (local_98 != (undefined1  [8])0x0) {
          if (((long)*(_func_int ***)((long)local_98 + 0x78) -
               (long)(((FuncSignature *)((long)local_98 + 0x70))->param_types).
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
            PrintError(this,&pMVar7->loc,"start function must be nullary");
          }
          if (((long)*(_func_int ***)((long)local_98 + 0x90) -
               (long)(((TypeVector *)((long)local_98 + 0x88))->
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
            PrintError(this,&pMVar7->loc,"start function must not return anything");
          }
        }
        bVar8 = true;
        break;
      case Except:
        this->current_except_index_ = this->current_except_index_ + 1;
        except = (Exception *)pMVar7[1].loc.filename.size_;
LAB_00f54454:
        CheckExcept(this,&pMVar7->loc,except);
      }
      pMVar7 = (pMVar7->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar7 != (ModuleField *)0x0);
    pMVar7 = (local_38->fields).first_;
    if (pMVar7 != (ModuleField *)0x0) {
      do {
        if (pMVar7->type_ == ElemSegment) {
          pVVar4 = (Var *)pMVar7[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
          for (var_01 = (Var *)pMVar7[3].super_intrusive_list_base<wabt::ModuleField>.next_;
              var_01 != pVVar4; var_01 = var_01 + 1) {
            CheckFuncVar(this,var_01,(Func **)0x0);
          }
          if ((pMVar7[2].loc.field_1.field2[0] == '\0') &&
             (RVar5 = CheckTableVar(this,(Var *)&pMVar7[1].loc.filename.size_,(Table **)local_98),
             RVar5.enum_ != Error)) {
            CheckConstInitExpr(this,&pMVar7->loc,*(ExprList **)((long)&pMVar7[2].loc.field_1 + 8),
                               (Type)pMVar7[3]._vptr_ModuleField,(char *)0xffffffff);
          }
        }
        pMVar7 = (pMVar7->super_intrusive_list_base<wabt::ModuleField>).next_;
      } while (pMVar7 != (ModuleField *)0x0);
      pMVar7 = (local_38->fields).first_;
      if (pMVar7 != (ModuleField *)0x0) {
        do {
          if (((pMVar7->type_ == DataSegment) && (pMVar7[2].loc.field_1.field2[0] == '\0')) &&
             (RVar5 = CheckMemoryVar(this,(Var *)&pMVar7[1].loc.filename.size_,(Memory **)local_98),
             RVar5.enum_ != Error)) {
            CheckConstInitExpr(this,&pMVar7->loc,*(ExprList **)((long)&pMVar7[2].loc.field_1 + 8),
                               (Type)pMVar7[3]._vptr_ModuleField,(char *)0xffffffff);
          }
          pMVar7 = (pMVar7->super_intrusive_list_base<wabt::ModuleField>).next_;
        } while (pMVar7 != (ModuleField *)0x0);
      }
    }
  }
  start_func = (Func *)0x0;
  local_80 = std::
             _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:1206:7)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/validator.cc:1206:7)>
             ::_M_manager;
  local_98 = (undefined1  [8])this;
  BindingHash::FindDuplicates(&local_38->export_bindings,(DuplicateCallback *)local_98);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)local_98,(_Any_data *)local_98,__destroy_functor);
  }
  return (Result)(this->result_).enum_;
}

Assistant:

Result Validator::CheckModule(const Module* module) {
  bool seen_start = false;

  current_module_ = module;
  current_table_index_ = 0;
  current_memory_index_ = 0;
  current_global_index_ = 0;
  num_imported_globals_ = 0;
  current_except_index_ = 0;

  for (const ModuleField& field : module->fields) {
    switch (field.type()) {
      case ModuleFieldType::Except:
        ++current_except_index_;
        CheckExcept(&field.loc, &cast<ExceptionModuleField>(&field)->except);
        break;

      case ModuleFieldType::Func:
        CheckFunc(&field.loc, &cast<FuncModuleField>(&field)->func);
        break;

      case ModuleFieldType::Global:
        CheckGlobal(&field.loc, &cast<GlobalModuleField>(&field)->global);
        current_global_index_++;
        break;

      case ModuleFieldType::Import:
        CheckImport(&field.loc, cast<ImportModuleField>(&field)->import.get());
        break;

      case ModuleFieldType::Export:
        CheckExport(&field.loc, &cast<ExportModuleField>(&field)->export_);
        break;

      case ModuleFieldType::Table:
        CheckTable(&field.loc, &cast<TableModuleField>(&field)->table);
        current_table_index_++;
        break;

      case ModuleFieldType::ElemSegment:
        // Checked below.
        break;

      case ModuleFieldType::Memory:
        CheckMemory(&field.loc, &cast<MemoryModuleField>(&field)->memory);
        current_memory_index_++;
        break;

      case ModuleFieldType::DataSegment:
        // Checked below.
        break;

      case ModuleFieldType::FuncType:
        break;

      case ModuleFieldType::Start: {
        if (seen_start) {
          PrintError(&field.loc, "only one start function allowed");
        }

        const Func* start_func = nullptr;
        CheckFuncVar(&cast<StartModuleField>(&field)->start, &start_func);
        if (start_func) {
          if (start_func->GetNumParams() != 0) {
            PrintError(&field.loc, "start function must be nullary");
          }

          if (start_func->GetNumResults() != 0) {
            PrintError(&field.loc, "start function must not return anything");
          }
        }
        seen_start = true;
        break;
      }
    }
  }

  CheckElemSegments(module);
  CheckDataSegments(module);
  CheckDuplicateExportBindings(module);

  return result_;
}